

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type __thiscall QList<QTreeWidgetItem_*>::takeFirst(QList<QTreeWidgetItem_*> *this)

{
  QTreeWidgetItem **ppQVar1;
  QPodArrayOps<QTreeWidgetItem_*> *this_00;
  QArrayDataPointer<QTreeWidgetItem_*> *in_RDI;
  value_type v;
  QList<QTreeWidgetItem_*> *in_stack_fffffffffffffff0;
  QTreeWidgetItem *pQVar2;
  
  ppQVar1 = first(in_stack_fffffffffffffff0);
  pQVar2 = *ppQVar1;
  this_00 = (QPodArrayOps<QTreeWidgetItem_*> *)
            QArrayDataPointer<QTreeWidgetItem_*>::operator->(in_RDI);
  QtPrivate::QPodArrayOps<QTreeWidgetItem_*>::eraseFirst(this_00);
  return pQVar2;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }